

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

int xlsxioread_sheet_next_row(xlsxioreadersheet sheethandle)

{
  XML_Status XVar1;
  bool bVar2;
  XML_Status status;
  xlsxioreadersheet sheethandle_local;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    sheethandle_local._4_4_ = 0;
  }
  else {
    sheethandle->lastcolnr = 0;
    if (sheethandle->paddingrow == 0) {
      sheethandle->paddingcol = 0;
      do {
        XVar1 = expat_process_zip_file_resume
                          (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser);
        bVar2 = false;
        if (XVar1 == XML_STATUS_SUSPENDED) {
          bVar2 = (sheethandle->processcallbackdata).colnr != 0;
        }
      } while (bVar2);
      sheethandle_local._4_4_ = (uint)(XVar1 == XML_STATUS_SUSPENDED);
    }
    else if (sheethandle->paddingrow < (sheethandle->processcallbackdata).rownr) {
      sheethandle_local._4_4_ = 3;
    }
    else {
      sheethandle->paddingrow = 0;
      sheethandle_local._4_4_ = 2;
    }
  }
  return sheethandle_local._4_4_;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_row (xlsxioreadersheet sheethandle)
{
  enum XML_Status status;
  if (!sheethandle) {
    return 0;
  }
  sheethandle->lastcolnr = 0;
  //when padding rows don't retrieve new data
  if (sheethandle->paddingrow) {
    if (sheethandle->paddingrow < sheethandle->processcallbackdata.rownr) {
      return 3;
    } else {
      sheethandle->paddingrow = 0;
      return 2;
    }
  }
  sheethandle->paddingcol = 0;
  //go to beginning of next row
  while ((status = expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser)) == XML_STATUS_SUSPENDED && sheethandle->processcallbackdata.colnr != 0) {
  }
  return (status == XML_STATUS_SUSPENDED ? 1 : 0);
}